

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetCurrentFont(ImFont *font)

{
  ImFontAtlas *pIVar1;
  ImGuiContext *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  pIVar2 = GImGui;
  if ((font != (ImFont *)0x0) && (pIVar1 = font->ContainerAtlas, pIVar1 != (ImFontAtlas *)0x0)) {
    fVar4 = font->Scale;
    fVar3 = 0.0;
    if (0.0 < fVar4) {
      GImGui->Font = font;
      fVar4 = fVar4 * (pIVar2->IO).FontGlobalScale * font->FontSize;
      fVar5 = 1.0;
      if (1.0 <= fVar4) {
        fVar5 = fVar4;
      }
      pIVar2->FontBaseSize = fVar5;
      if (pIVar2->CurrentWindow != (ImGuiWindow *)0x0) {
        fVar3 = fVar5 * pIVar2->CurrentWindow->FontWindowScale;
      }
      pIVar2->FontSize = fVar3;
      (pIVar2->DrawListSharedData).TexUvWhitePixel = pIVar1->TexUvWhitePixel;
      (pIVar2->DrawListSharedData).Font = font;
      (pIVar2->DrawListSharedData).FontSize = fVar3;
      return;
    }
    __assert_fail("font->Scale > 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0x16ec,"void ImGui::SetCurrentFont(ImFont *)");
  }
  __assert_fail("font && font->IsLoaded()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                ,0x16eb,"void ImGui::SetCurrentFont(ImFont *)");
}

Assistant:

void ImGui::SetCurrentFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(font && font->IsLoaded());    // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(font->Scale > 0.0f);
    g.Font = font;
    g.FontBaseSize = ImMax(1.0f, g.IO.FontGlobalScale * g.Font->FontSize * g.Font->Scale);
    g.FontSize = g.CurrentWindow ? g.CurrentWindow->CalcFontSize() : 0.0f;

    ImFontAtlas* atlas = g.Font->ContainerAtlas;
    g.DrawListSharedData.TexUvWhitePixel = atlas->TexUvWhitePixel;
    g.DrawListSharedData.Font = g.Font;
    g.DrawListSharedData.FontSize = g.FontSize;
}